

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnTrainer.cpp
# Opt level: O0

DNN_NUMERIC __thiscall tfs::DnnTrainer::train(DnnTrainer *this,DNN_INTEGER expectation)

{
  bool bVar1;
  Dnn *in_RSI;
  undefined8 *in_RDI;
  DNN_NUMERIC DVar2;
  Dnn *in_stack_ffffffffffffffd8;
  DNN_NUMERIC local_8;
  
  in_RDI[6] = 0;
  if (in_RDI[1] == 0) {
    report_problem("Error",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnTrainer.cpp"
                   ,"train",0xd9,"No DNN set");
    local_8 = (DNN_NUMERIC)in_RDI[6];
  }
  else if (in_RDI[7] == 0) {
    report_problem("Error",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnTrainer.cpp"
                   ,"train",0xdd,"Batch size 0 - will be a divide by zero error");
    local_8 = (DNN_NUMERIC)in_RDI[6];
  }
  else if ((in_RDI[9] == 0) || (in_RDI[10] == 0)) {
    report_problem("Error",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnTrainer.cpp"
                   ,"train",0xe1,"No gradients available for training");
    local_8 = (DNN_NUMERIC)in_RDI[6];
  }
  else {
    bVar1 = Dnn::forward(in_stack_ffffffffffffffd8);
    if (bVar1) {
      DVar2 = Dnn::backprop(in_RSI,(DNN_INTEGER)in_RDI);
      in_RDI[6] = DVar2;
      in_RDI[8] = in_RDI[8] + 1;
      if ((ulong)in_RDI[8] % (ulong)in_RDI[7] == 0) {
        local_8 = (DNN_NUMERIC)(**(code **)*in_RDI)();
      }
      else {
        local_8 = (DNN_NUMERIC)in_RDI[6];
      }
    }
    else {
      local_8 = (DNN_NUMERIC)in_RDI[6];
    }
  }
  return local_8;
}

Assistant:

DNN_NUMERIC
    DnnTrainer::train( const DNN_INTEGER expectation ) {
        // Assume: Input matrix already set for the DNN
        m_loss = 0.0;
        if( m_dnn == 0 ) {
            log_error( "No DNN set" );
            return m_loss;
        }
        if( m_batch_size == 0 ) {
            log_error( "Batch size 0 - will be a divide by zero error" );
            return m_loss;
        }
        if( m_trainable_handle == 0 || m_trainable_end == 0 ) {
            log_error( "No gradients available for training" );
            return m_loss;
        }
        if( !m_dnn->forward()) {
            return m_loss;
        }
        m_loss = m_dnn->backprop( expectation );
        m_k++;
        if( m_k % m_batch_size ) {
            return m_loss;
        }
        return adjustWeights();
    }